

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_13::NameResolver::ResolveLocalVar(NameResolver *this,Var *var)

{
  Index index;
  
  if ((var->type_ != Name) || (this->current_func_ == (Func *)0x0)) {
    return;
  }
  index = Func::GetLocalIndex(this->current_func_,var);
  if (index != 0xffffffff) {
    Var::set_index(var,index);
    return;
  }
  if (var->type_ == Name) {
    PrintError(this,&var->loc,"undefined local variable \"%s\"",
               (var->field_2).name_._M_dataplus._M_p);
    return;
  }
  __assert_fail("is_name()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                ,0x37,"const std::string &wabt::Var::name() const");
}

Assistant:

void NameResolver::ResolveLocalVar(Var* var) {
  if (var->is_name()) {
    if (!current_func_) {
      return;
    }

    Index index = current_func_->GetLocalIndex(*var);
    if (index == kInvalidIndex) {
      PrintError(&var->loc, "undefined local variable \"%s\"",
                 var->name().c_str());
      return;
    }

    var->set_index(index);
  }
}